

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

Alignment * __thiscall
spoa::SisdAlignmentEngine::Align
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,char *sequence,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  AlignmentSubtype AVar1;
  pointer puVar2;
  pointer puVar3;
  int64_t iVar4;
  invalid_argument *this_00;
  
  if ((int)sequence_len < 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::SisdAlignmentEngine::Align] error: too large sequence!");
LAB_00115ecb:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar2 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sequence_len != 0 && puVar2 != puVar3) {
    iVar4 = AlignmentEngine::WorstCaseAlignmentScore
                      (&this->super_AlignmentEngine,(ulong)sequence_len,
                       (long)puVar3 - (long)puVar2 >> 3);
    if (iVar4 < -0x7ffffc00) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"[spoa::SisdAlignmentEngine::Align] error: possible overflow!");
      goto LAB_00115ecb;
    }
    Realloc(this,(ulong)(sequence_len + 1),
            ((long)(graph->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) + 1,(uint8_t)graph->num_codes_);
    Initialize(this,sequence,sequence_len,graph);
    AVar1 = (this->super_AlignmentEngine).subtype_;
    if (AVar1 == kConvex) {
      Convex(__return_storage_ptr__,this,sequence_len,graph,score);
      return __return_storage_ptr__;
    }
    if (AVar1 == kAffine) {
      Affine(__return_storage_ptr__,this,sequence_len,graph,score);
      return __return_storage_ptr__;
    }
    if (AVar1 == kLinear) {
      Linear(__return_storage_ptr__,this,sequence_len,graph,score);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Alignment SisdAlignmentEngine::Align(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) {
  if (sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: too large sequence!");
  }

  if (graph.nodes().empty() || sequence_len == 0) {
    return Alignment();
  }

  if (WorstCaseAlignmentScore(sequence_len, graph.nodes().size()) < kNegativeInfinity) {  // NOLINT
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: possible overflow!");
  }

  try {
    Realloc(sequence_len + 1, graph.nodes().size() + 1, graph.num_codes());
  } catch (std::bad_alloc& ba) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: insufficient memory!");
  }
  Initialize(sequence, sequence_len, graph);

  if (subtype_ == AlignmentSubtype::kLinear) {
    return Linear(sequence_len, graph, score);
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    return Affine(sequence_len, graph, score);
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    return Convex(sequence_len, graph, score);
  }
  return Alignment();
}